

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkValidate.cpp
# Opt level: O1

void __thiscall
glslang::TIntermediate::checkCallGraphBodies
          (TIntermediate *this,TInfoSink *infoSink,bool keepUncalled)

{
  TGraph *pTVar1;
  byte bVar2;
  TIntermediate *pTVar3;
  TInfoSink *infoSink_00;
  int iVar4;
  _List_node_base *p_Var5;
  undefined4 extraout_var;
  long lVar6;
  long *plVar7;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *pbVar8;
  ulong uVar9;
  undefined4 extraout_var_00;
  TString *deadCaller;
  __normal_iterator<TIntermNode_**,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>
  _Var10;
  long lVar11;
  undefined7 in_register_00000011;
  bool bVar12;
  __normal_iterator<TIntermNode_**,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>
  __last;
  difference_type __n;
  ulong uVar13;
  _List_node_base *p_Var14;
  vector<bool,_std::allocator<bool>_> reachable;
  allocator_type local_79;
  TIntermediate *local_78;
  undefined4 local_6c;
  vector<bool,_std::allocator<bool>_> local_68;
  TInfoSink *local_40;
  undefined8 local_38;
  
  local_6c = (undefined4)CONCAT71(in_register_00000011,keepUncalled);
  pTVar1 = &this->callGraph;
  for (p_Var5 = (this->callGraph).super__List_base<glslang::TCall,_std::allocator<glslang::TCall>_>.
                _M_impl._M_node.super__List_node_base._M_next; p_Var5 != (_List_node_base *)pTVar1;
      p_Var5 = p_Var5->_M_next) {
    *(undefined1 *)&p_Var5[6]._M_next = 0;
    *(undefined4 *)((long)&p_Var5[6]._M_next + 4) = 0xffffffff;
  }
  local_78 = this;
  local_40 = infoSink;
  iVar4 = (*this->treeRoot->_vptr_TIntermNode[6])();
  lVar6 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar4) + 400))
                    ((long *)CONCAT44(extraout_var,iVar4));
  local_38 = CONCAT71(local_38._1_7_,1);
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_68,*(long *)(lVar6 + 0x10) - *(long *)(lVar6 + 8) >> 3,(bool *)&local_38,
             &local_79);
  lVar11 = *(long *)(lVar6 + 8);
  if (0 < (int)((ulong)(*(long *)(lVar6 + 0x10) - lVar11) >> 3)) {
    uVar13 = 0;
    do {
      plVar7 = (long *)(**(code **)(**(long **)(lVar11 + uVar13 * 8) + 0x30))();
      if ((plVar7 != (long *)0x0) && ((int)plVar7[0x17] == 5)) {
        pbVar8 = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                 (**(code **)(*plVar7 + 0x1a8))(plVar7);
        iVar4 = std::__cxx11::
                basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                          (pbVar8,(local_78->entryPointMangledName)._M_dataplus._M_p);
        if (iVar4 != 0) {
          bVar2 = (byte)uVar13 & 0x3f;
          local_68.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p[uVar13 >> 6] =
               local_68.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
               _M_start.super__Bit_iterator_base._M_p[uVar13 >> 6] &
               (-2L << bVar2 | 0xfffffffffffffffeU >> 0x40 - bVar2);
        }
        for (p_Var5 = (pTVar1->super__List_base<glslang::TCall,_std::allocator<glslang::TCall>_>).
                      _M_impl._M_node.super__List_node_base._M_next;
            p_Var5 != (_List_node_base *)pTVar1; p_Var5 = p_Var5->_M_next) {
          pbVar8 = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                   (**(code **)(*plVar7 + 0x1a8))(plVar7);
          iVar4 = std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                  compare((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                           *)&p_Var5[3]._M_prev,pbVar8);
          if (iVar4 == 0) {
            *(int *)((long)&p_Var5[6]._M_next + 4) = (int)uVar13;
          }
        }
      }
      uVar13 = uVar13 + 1;
      lVar11 = *(long *)(lVar6 + 8);
    } while ((long)uVar13 < (long)(int)((ulong)(*(long *)(lVar6 + 0x10) - lVar11) >> 3));
  }
  pTVar3 = local_78;
  for (p_Var5 = (pTVar1->super__List_base<glslang::TCall,_std::allocator<glslang::TCall>_>)._M_impl.
                _M_node.super__List_node_base._M_next; p_Var5 != (_List_node_base *)pTVar1;
      p_Var5 = p_Var5->_M_next) {
    iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::compare((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                      (p_Var5 + 1),(pTVar3->entryPointMangledName)._M_dataplus._M_p);
    if (iVar4 == 0) {
      *(undefined1 *)&p_Var5[6]._M_next = 1;
    }
  }
  p_Var5 = (pTVar1->super__List_base<glslang::TCall,_std::allocator<glslang::TCall>_>)._M_impl.
           _M_node.super__List_node_base._M_next;
  if (p_Var5 != (_List_node_base *)pTVar1) {
    bVar12 = false;
    do {
      do {
        if ((*(char *)&p_Var5[6]._M_next == '\x01') &&
           (p_Var14 = (pTVar1->super__List_base<glslang::TCall,_std::allocator<glslang::TCall>_>).
                      _M_impl._M_node.super__List_node_base._M_next,
           p_Var14 != (_List_node_base *)pTVar1)) {
          do {
            if ((*(char *)&p_Var14[6]._M_next == '\0') &&
               (iVar4 = std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                        compare((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                 *)&p_Var5[3]._M_prev,
                                (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                 *)(p_Var14 + 1)), iVar4 == 0)) {
              *(undefined1 *)&p_Var14[6]._M_next = 1;
              bVar12 = true;
            }
            p_Var14 = p_Var14->_M_next;
          } while (p_Var14 != (_List_node_base *)pTVar1);
        }
        p_Var5 = p_Var5->_M_next;
      } while (p_Var5 != (_List_node_base *)pTVar1);
      if (!bVar12) break;
      p_Var5 = (pTVar1->super__List_base<glslang::TCall,_std::allocator<glslang::TCall>_>)._M_impl.
               _M_node.super__List_node_base._M_next;
      bVar12 = false;
    } while (p_Var5 != (_List_node_base *)pTVar1);
  }
  infoSink_00 = local_40;
  pTVar3 = local_78;
  for (p_Var5 = (pTVar1->super__List_base<glslang::TCall,_std::allocator<glslang::TCall>_>)._M_impl.
                _M_node.super__List_node_base._M_next; local_78 = pTVar3,
      p_Var5 != (_List_node_base *)pTVar1; p_Var5 = p_Var5->_M_next) {
    if (*(char *)&p_Var5[6]._M_next == '\x01') {
      iVar4 = *(int *)((long)&p_Var5[6]._M_next + 4);
      uVar13 = (ulong)iVar4;
      if (uVar13 == 0xffffffffffffffff) {
        error(pTVar3,infoSink_00,"No function definition (body) found: ",EShLangCount);
        TInfoSinkBase::append(&infoSink_00->info,"    ");
        TInfoSinkBase::append(&infoSink_00->info,(TString *)&p_Var5[3]._M_prev);
        TInfoSinkBase::append(&infoSink_00->info,"\n");
      }
      else {
        uVar9 = uVar13 + 0x3f;
        if (-1 < (long)uVar13) {
          uVar9 = uVar13;
        }
        local_68.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p
        [((long)uVar9 >> 6) + ((ulong)((uVar13 & 0x800000000000003f) < 0x8000000000000001) - 1)] =
             local_68.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_start.super__Bit_iterator_base._M_p
             [((long)uVar9 >> 6) + ((ulong)((uVar13 & 0x800000000000003f) < 0x8000000000000001) - 1)
             ] | 1L << ((byte)iVar4 & 0x3f);
      }
    }
    pTVar3 = local_78;
  }
  if ((char)local_6c == '\0') {
    _Var10._M_current = *(TIntermNode ***)(lVar6 + 8);
    __last._M_current = *(TIntermNode ***)(lVar6 + 0x10);
    if (0 < (int)((ulong)((long)__last._M_current - (long)_Var10._M_current) >> 3)) {
      uVar13 = 0;
      do {
        if ((local_68.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_start.super__Bit_iterator_base._M_p[uVar13 >> 6] >> (uVar13 & 0x3f) & 1) == 0) {
          iVar4 = (*_Var10._M_current[uVar13]->_vptr_TIntermNode[6])();
          deadCaller = (TString *)
                       (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar4) + 0x1a8))
                                 ((long *)CONCAT44(extraout_var_00,iVar4));
          resetTopLevelUncalledStatus(pTVar3,deadCaller);
          *(undefined8 *)(*(long *)(lVar6 + 8) + uVar13 * 8) = 0;
        }
        uVar13 = uVar13 + 1;
        _Var10._M_current = *(TIntermNode ***)(lVar6 + 8);
        __last._M_current = *(TIntermNode ***)(lVar6 + 0x10);
      } while ((long)uVar13 <
               (long)(int)((ulong)((long)__last._M_current - (long)_Var10._M_current) >> 3));
    }
    local_38 = 0;
    _Var10 = std::
             __remove_if<__gnu_cxx::__normal_iterator<TIntermNode**,std::vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>>>,__gnu_cxx::__ops::_Iter_equals_val<decltype(nullptr)const>>
                       (_Var10,__last,(_Iter_equals_val<const_std::nullptr_t>)&local_38);
    if ((_Var10._M_current != *(TIntermNode ***)(lVar6 + 0x10)) &&
       (lVar11 = (long)_Var10._M_current +
                 (*(long *)(lVar6 + 0x10) - (long)*(TIntermNode ***)(lVar6 + 0x10)),
       *(long *)(lVar6 + 0x10) != lVar11)) {
      *(long *)(lVar6 + 0x10) = lVar11;
    }
  }
  if (local_68.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_68.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_68.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_68.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  return;
}

Assistant:

void TIntermediate::checkCallGraphBodies(TInfoSink& infoSink, bool keepUncalled)
{
    // Clear fields we'll use for this.
    for (TGraph::iterator call = callGraph.begin(); call != callGraph.end(); ++call) {
        call->visited = false;
        call->calleeBodyPosition = -1;
    }

    // The top level of the AST includes function definitions (bodies).
    // Compare these to function calls in the call graph.
    // We'll end up knowing which have bodies, and if so,
    // how to map the call-graph node to the location in the AST.
    TIntermSequence &functionSequence = getTreeRoot()->getAsAggregate()->getSequence();
    std::vector<bool> reachable(functionSequence.size(), true); // so that non-functions are reachable
    for (int f = 0; f < (int)functionSequence.size(); ++f) {
        glslang::TIntermAggregate* node = functionSequence[f]->getAsAggregate();
        if (node && (node->getOp() == glslang::EOpFunction)) {
            if (node->getName().compare(getEntryPointMangledName().c_str()) != 0)
                reachable[f] = false; // so that function bodies are unreachable, until proven otherwise
            for (TGraph::iterator call = callGraph.begin(); call != callGraph.end(); ++call) {
                if (call->callee == node->getName())
                    call->calleeBodyPosition = f;
            }
        }
    }

    // Start call-graph traversal by visiting the entry point nodes.
    for (TGraph::iterator call = callGraph.begin(); call != callGraph.end(); ++call) {
        if (call->caller.compare(getEntryPointMangledName().c_str()) == 0)
            call->visited = true;
    }

    // Propagate 'visited' through the call-graph to every part of the graph it
    // can reach (seeded with the entry-point setting above).
    bool changed;
    do {
        changed = false;
        for (auto call1 = callGraph.begin(); call1 != callGraph.end(); ++call1) {
            if (call1->visited) {
                for (TGraph::iterator call2 = callGraph.begin(); call2 != callGraph.end(); ++call2) {
                    if (! call2->visited) {
                        if (call1->callee == call2->caller) {
                            changed = true;
                            call2->visited = true;
                        }
                    }
                }
            }
        }
    } while (changed);

    // Any call-graph node set to visited but without a callee body is an error.
    for (TGraph::iterator call = callGraph.begin(); call != callGraph.end(); ++call) {
        if (call->visited) {
            if (call->calleeBodyPosition == -1) {
                error(infoSink, "No function definition (body) found: ");
                infoSink.info << "    " << call->callee << "\n";
            } else
                reachable[call->calleeBodyPosition] = true;
        }
    }

    // Bodies in the AST not reached by the call graph are dead;
    // clear them out, since they can't be reached and also can't
    // be translated further due to possibility of being ill defined.
    if (! keepUncalled) {
        for (int f = 0; f < (int)functionSequence.size(); ++f) {
            if (! reachable[f])
            {
                resetTopLevelUncalledStatus(functionSequence[f]->getAsAggregate()->getName());
                functionSequence[f] = nullptr;
            }
        }
        functionSequence.erase(std::remove(functionSequence.begin(), functionSequence.end(), nullptr), functionSequence.end());
    }
}